

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode error_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  char all [256];
  char acStack_118 [264];
  
  if (((byte)type & nbytes != 0) != 0) {
    Curl_all_content_encodings(acStack_118,0x100);
    Curl_failf(data,"Unrecognized content encoding type. libcurl understands %s content encodings.",
               acStack_118);
    return CURLE_BAD_CONTENT_ENCODING;
  }
  CVar1 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  return CVar1;
}

Assistant:

static CURLcode error_do_write(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               const char *buf, size_t nbytes)
{
  (void) writer;
  (void) buf;
  (void) nbytes;

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);
  else {
    char all[256];
    (void)Curl_all_content_encodings(all, sizeof(all));
    failf(data, "Unrecognized content encoding type. "
          "libcurl understands %s content encodings.", all);
  }
  return CURLE_BAD_CONTENT_ENCODING;
}